

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O2

WW<135UL> * __thiscall GF2::WW<135UL>::Permute(WW<135UL> *this,size_t *pi)

{
  ulong uVar1;
  WW<135UL> *pWVar2;
  size_t pos;
  size_t pos_00;
  bool val;
  WW<135UL> temp;
  WW<135UL> WStack_38;
  
  SetAllZero(&WStack_38);
  for (pos_00 = 0; pos_00 != 0x87; pos_00 = pos_00 + 1) {
    uVar1 = pi[pos_00];
    if (uVar1 == 0xffffffffffffffff) {
      val = false;
    }
    else {
      val = (this->_words[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) != 0;
    }
    Set(&WStack_38,pos_00,val);
  }
  pWVar2 = operator=(this,&WStack_38);
  return pWVar2;
}

Assistant:

WW& Permute(const size_t pi[_n])
	{	
		WW<_n> temp;
		for (size_t pos = 0; pos < _n; ++pos)
			temp.Set(pos, pi[pos] == SIZE_MAX ? 0 : Test(pi[pos]));
		return operator=(temp);
	}